

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall wallet::DescriptorScriptPubKeyMan::TopUp(DescriptorScriptPubKeyMan *this,uint size)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  WalletBatch local_80;
  char local_70 [32];
  string local_50;
  long local_30;
  WalletDatabase *pWVar4;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
  pWVar4 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_80,pWVar4,1);
  local_80.m_database = pWVar4;
  bVar1 = WalletBatch::TxnBegin(&local_80);
  if (bVar1) {
    bVar1 = TopUpWithDB(this,&local_80,size);
    bVar2 = WalletBatch::TxnCommit(&local_80);
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[2])(local_70);
      tinyformat::format<std::__cxx11::string>
                (&local_50,
                 (tinyformat *)
                 "Error during descriptors keypool top up. Cannot commit changes for wallet %s",
                 local_70,in_RCX);
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00bde861;
    }
  }
  else {
    bVar1 = false;
  }
  if (local_80.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_80.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
LAB_00bde861:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::TopUp(unsigned int size)
{
    WalletBatch batch(m_storage.GetDatabase());
    if (!batch.TxnBegin()) return false;
    bool res = TopUpWithDB(batch, size);
    if (!batch.TxnCommit()) throw std::runtime_error(strprintf("Error during descriptors keypool top up. Cannot commit changes for wallet %s", m_storage.GetDisplayName()));
    return res;
}